

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O0

bool __thiscall
google::protobuf::UnknownFieldSet::MergeFromCodedStream
          (UnknownFieldSet *this,CodedInputStream *input)

{
  bool bVar1;
  undefined1 local_30 [8];
  UnknownFieldSet other;
  CodedInputStream *input_local;
  UnknownFieldSet *this_local;
  
  other.fields_.soo_rep_.field_0.short_rep.field_1 =
       (anon_union_8_2_4f9aec01_for_ShortSooRep_1)input;
  UnknownFieldSet((UnknownFieldSet *)local_30);
  bVar1 = internal::WireFormat::SkipMessage
                    ((CodedInputStream *)other.fields_.soo_rep_.field_0.short_rep.field_1,
                     (UnknownFieldSet *)local_30);
  if ((bVar1) &&
     (bVar1 = io::CodedInputStream::ConsumedEntireMessage
                        ((CodedInputStream *)other.fields_.soo_rep_.field_0.short_rep.field_1),
     bVar1)) {
    MergeFromAndDestroy(this,(UnknownFieldSet *)local_30);
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  ~UnknownFieldSet((UnknownFieldSet *)local_30);
  return this_local._7_1_;
}

Assistant:

bool UnknownFieldSet::MergeFromCodedStream(io::CodedInputStream* input) {
  UnknownFieldSet other;
  if (internal::WireFormat::SkipMessage(input, &other) &&
      input->ConsumedEntireMessage()) {
    MergeFromAndDestroy(&other);
    return true;
  } else {
    return false;
  }
}